

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall tinygltf::Buffer::operator==(Buffer *this,Buffer *other)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  
  __s1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar4 = (long)puVar1 - (long)__s1;
  __s2 = (other->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (((sVar4 == (long)(other->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)__s2) &&
      ((((puVar1 == __s1 || (iVar3 = bcmp(__s1,__s2,sVar4), iVar3 == 0)) &&
        ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
       ((bVar2 = std::__equal<false>::
                 equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                           ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                            (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                             )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                            (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                           ), bVar2 && (bVar2 = Equals(&this->extras,&other->extras), bVar2)))))) &&
     ((sVar4 = (this->name)._M_string_length, sVar4 == (other->name)._M_string_length &&
      (((sVar4 == 0 ||
        (iVar3 = bcmp((this->name)._M_dataplus._M_p,(other->name)._M_dataplus._M_p,sVar4),
        iVar3 == 0)) &&
       (sVar4 = (this->uri)._M_string_length, sVar4 == (other->uri)._M_string_length)))))) {
    if (sVar4 != 0) {
      iVar3 = bcmp((this->uri)._M_dataplus._M_p,(other->uri)._M_dataplus._M_p,sVar4);
      return iVar3 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool Buffer::operator==(const Buffer &other) const {
  return this->data == other.data && this->extensions == other.extensions &&
         this->extras == other.extras && this->name == other.name &&
         this->uri == other.uri;
}